

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
* __thiscall
capnproto_test::capnp::test::TestMoreStuff::Client::throwExceptionWithDetailRequest
          (Request<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
            (__return_storage_ptr__,(Client *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),
             0xddc70bf9784133cf,0x10,&local_20,(CallHints)0x1);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
TestMoreStuff::Client::throwExceptionWithDetailRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>(
      0xddc70bf9784133cfull, 16, sizeHint, {true});
}